

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O3

bool llvm::consumeSignedInteger(StringRef *Str,uint Radix,longlong *Result)

{
  bool bVar1;
  bool bVar2;
  undefined1 auStack_38 [8];
  StringRef Str2;
  unsigned_long_long ULLVal;
  
  if ((Str->Length == 0) || (*Str->Data != '-')) {
    bVar1 = consumeUnsignedInteger(Str,Radix,&Str2.Length);
    bVar2 = true;
    if (-1 < (long)Str2.Length && !bVar1) {
      *Result = Str2.Length;
      bVar2 = false;
    }
  }
  else {
    auStack_38 = (undefined1  [8])(Str->Data + 1);
    Str2.Data = (char *)(Str->Length - 1);
    bVar1 = consumeUnsignedInteger((StringRef *)auStack_38,Radix,&Str2.Length);
    bVar2 = 0x8000000000000000 < Str2.Length || bVar1;
    if (0x8000000000000000 >= Str2.Length && !bVar1) {
      Str->Data = (char *)auStack_38;
      Str->Length = (size_t)Str2.Data;
      *Result = -Str2.Length;
    }
  }
  return bVar2;
}

Assistant:

bool llvm::consumeSignedInteger(StringRef &Str, unsigned Radix,
                                long long &Result) {
  unsigned long long ULLVal;

  // Handle positive strings first.
  if (Str.empty() || Str.front() != '-') {
    if (consumeUnsignedInteger(Str, Radix, ULLVal) ||
        // Check for value so large it overflows a signed value.
        (long long)ULLVal < 0)
      return true;
    Result = ULLVal;
    return false;
  }

  // Get the positive part of the value.
  StringRef Str2 = Str.drop_front(1);
  if (consumeUnsignedInteger(Str2, Radix, ULLVal) ||
      // Reject values so large they'd overflow as negative signed, but allow
      // "-0".  This negates the unsigned so that the negative isn't undefined
      // on signed overflow.
      (long long)-ULLVal > 0)
    return true;

  Str = Str2;
  Result = -ULLVal;
  return false;
}